

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O0

void * __thiscall tinyxml2::MemPoolT<88>::Alloc(MemPoolT<88> *this)

{
  void *pvVar1;
  DynArray<tinyxml2::MemPoolT<88>::Block_*,_10> *this_00;
  long in_RDI;
  void *result;
  int i;
  Block *block;
  Block *in_stack_ffffffffffffffc8;
  int local_14;
  
  if (*(long *)(in_RDI + 0x68) == 0) {
    this_00 = (DynArray<tinyxml2::MemPoolT<88>::Block_*,_10> *)operator_new(0xfd0);
    memset(this_00,0,0xfd0);
    DynArray<tinyxml2::MemPoolT<88>::Block_*,_10>::Push(this_00,in_stack_ffffffffffffffc8);
    for (local_14 = 0; local_14 < 0x2d; local_14 = local_14 + 1) {
      this_00->_pool[(long)local_14 * 0xb + -1] =
           (Block *)(this_00->_pool + (long)(local_14 + 1) * 0xb + -1);
    }
    this_00[0x29]._pool[2] = (Block *)0x0;
    *(DynArray<tinyxml2::MemPoolT<88>::Block_*,_10> **)(in_RDI + 0x68) = this_00;
  }
  pvVar1 = *(void **)(in_RDI + 0x68);
  *(undefined8 *)(in_RDI + 0x68) = **(undefined8 **)(in_RDI + 0x68);
  *(int *)(in_RDI + 0x70) = *(int *)(in_RDI + 0x70) + 1;
  if (*(int *)(in_RDI + 0x78) < *(int *)(in_RDI + 0x70)) {
    *(undefined4 *)(in_RDI + 0x78) = *(undefined4 *)(in_RDI + 0x70);
  }
  *(int *)(in_RDI + 0x74) = *(int *)(in_RDI + 0x74) + 1;
  *(int *)(in_RDI + 0x7c) = *(int *)(in_RDI + 0x7c) + 1;
  return pvVar1;
}

Assistant:

virtual void* Alloc() {
        if ( !_root ) {
            // Need a new block.
            Block* block = new Block();
            _blockPtrs.Push( block );

            for( int i=0; i<COUNT-1; ++i ) {
                block->chunk[i].next = &block->chunk[i+1];
            }
            block->chunk[COUNT-1].next = 0;
            _root = block->chunk;
        }
        void* result = _root;
        _root = _root->next;

        ++_currentAllocs;
        if ( _currentAllocs > _maxAllocs ) {
            _maxAllocs = _currentAllocs;
        }
        _nAllocs++;
        _nUntracked++;
        return result;
    }